

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

Benchmark * __thiscall benchmark::internal::Benchmark::Range(Benchmark *this,int start,int limit)

{
  pointer pvVar1;
  pointer pvVar2;
  CheckHandler local_20;
  
  pvVar1 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pvVar1 != pvVar2) &&
      ((~((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start) & 0x3fffffffcU) != 0)) &&
     ((pvVar1 == pvVar2 ||
      (((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start & 0x3fffffffcU) != 4)))) {
    CheckHandler::CheckHandler
              (&local_20,"imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"Range",0x2ad);
    CheckHandler::~CheckHandler(&local_20);
  }
  GetNullLogInstance();
  BenchmarkImp::Range(this->imp_,start,limit);
  return this;
}

Assistant:

Benchmark* Benchmark::Range(int start, int limit) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Range(start, limit);
  return this;
}